

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  void *pvVar2;
  Maze *m2;
  BombedMazeGame myBombedGame;
  Maze *m1;
  MazeGame myGame;
  
  MazeGame::MazeGame((MazeGame *)&m1);
  _myBombedGame = (void *)MazeGame::CreateMaze();
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_myBombedGame);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  BombedMazeGame::BombedMazeGame((BombedMazeGame *)&m2);
  pvVar2 = (void *)MazeGame::CreateMaze();
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pvVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    MazeGame myGame;
    Maze* m1 = myGame.CreateMaze();
    std::cout << m1 << std::endl;

    BombedMazeGame myBombedGame;
    Maze* m2 = myBombedGame.CreateMaze();
    std::cout << m2 << std::endl;
}